

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateFormatSymbols::getMonths
          (DateFormatSymbols *this,int32_t *count,DtContextType context,DtWidthType width)

{
  UnicodeString *local_28;
  UnicodeString *returnValue;
  DtWidthType width_local;
  DtContextType context_local;
  int32_t *count_local;
  DateFormatSymbols *this_local;
  
  local_28 = (UnicodeString *)0x0;
  if (context == FORMAT) {
    switch(width) {
    case ABBREVIATED:
    case SHORT:
      *count = this->fShortMonthsCount;
      local_28 = this->fShortMonths;
      break;
    case WIDE:
      *count = this->fMonthsCount;
      local_28 = this->fMonths;
      break;
    case NARROW:
      *count = this->fNarrowMonthsCount;
      local_28 = this->fNarrowMonths;
      break;
    case DT_WIDTH_COUNT:
    }
  }
  else if (context == STANDALONE) {
    switch(width) {
    case ABBREVIATED:
    case SHORT:
      *count = this->fStandaloneShortMonthsCount;
      local_28 = this->fStandaloneShortMonths;
      break;
    case WIDE:
      *count = this->fStandaloneMonthsCount;
      local_28 = this->fStandaloneMonths;
      break;
    case NARROW:
      *count = this->fStandaloneNarrowMonthsCount;
      local_28 = this->fStandaloneNarrowMonths;
      break;
    case DT_WIDTH_COUNT:
    }
  }
  return local_28;
}

Assistant:

const UnicodeString*
DateFormatSymbols::getMonths(int32_t &count, DtContextType context, DtWidthType width ) const
{
    UnicodeString *returnValue = NULL;

    switch (context) {
    case FORMAT :
        switch(width) {
        case WIDE :
            count = fMonthsCount;
            returnValue = fMonths;
            break;
        case ABBREVIATED :
        case SHORT : // no month data for this, defaults to ABBREVIATED
            count = fShortMonthsCount;
            returnValue = fShortMonths;
            break;
        case NARROW :
            count = fNarrowMonthsCount;
            returnValue = fNarrowMonths;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case STANDALONE :
        switch(width) {
        case WIDE :
            count = fStandaloneMonthsCount;
            returnValue = fStandaloneMonths;
            break;
        case ABBREVIATED :
        case SHORT : // no month data for this, defaults to ABBREVIATED
            count = fStandaloneShortMonthsCount;
            returnValue = fStandaloneShortMonths;
            break;
        case NARROW :
            count = fStandaloneNarrowMonthsCount;
            returnValue = fStandaloneNarrowMonths;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
    return returnValue;
}